

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::Load(Segment *this)

{
  long lVar1;
  long status;
  longlong header_status;
  Segment *this_local;
  
  if (((this->m_clusters == (Cluster **)0x0) && (this->m_clusterSize == 0)) &&
     (this->m_clusterCount == 0)) {
    this_local = (Segment *)ParseHeaders(this);
    if (-1 < (long)this_local) {
      if ((long)this_local < 1) {
        if ((this->m_pInfo == (SegmentInfo *)0x0) || (this->m_pTracks == (Tracks *)0x0)) {
          this_local = (Segment *)0xfffffffffffffffe;
        }
        else {
          do {
            lVar1 = LoadCluster(this);
            if (lVar1 < 0) {
              return lVar1;
            }
            if (0 < lVar1) {
              return 0;
            }
          } while (this->m_type != kTypeLiveStream);
          this_local = (Segment *)0x0;
        }
      }
      else {
        this_local = (Segment *)0xfffffffffffffffd;
      }
    }
  }
  else {
    this_local = (Segment *)0xffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

long Segment::Load() {
  if (m_clusters != NULL || m_clusterSize != 0 || m_clusterCount != 0)
    return E_PARSE_FAILED;

  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.

  const long long header_status = ParseHeaders();

  if (header_status < 0)  // error
    return static_cast<long>(header_status);

  if (header_status > 0)  // underflow
    return E_BUFFER_NOT_FULL;

  if (m_pInfo == NULL || m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  for (;;) {
    const long status = LoadCluster();

    if (status < 0)  // error
      return status;

    if (status >= 1)  // no more clusters
      return 0;

    if (m_type == kTypeLiveStream)
      return 0; // Live streams only have one cluster loaded at any point in time.
  }
}